

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O2

S1Interval __thiscall S1Interval::Complement(S1Interval *this)

{
  double hi;
  double lo;
  S1Interval local_18;
  
  hi = (this->bounds_).c_[0];
  lo = (this->bounds_).c_[1];
  if ((hi != lo) || (NAN(hi) || NAN(lo))) {
    S1Interval(&local_18,lo,hi,ARGS_CHECKED);
  }
  else {
    local_18 = Full();
  }
  return (Vector2_d)(Vector2_d)local_18;
}

Assistant:

bool S1Interval::Contains(const S1Interval& y) const {
  // It might be helpful to compare the structure of these tests to
  // the simpler Contains(double) method above.

  if (is_inverted()) {
    if (y.is_inverted()) return y.lo() >= lo() && y.hi() <= hi();
    return (y.lo() >= lo() || y.hi() <= hi()) && !is_empty();
  } else {
    if (y.is_inverted()) return is_full() || y.is_empty();
    return y.lo() >= lo() && y.hi() <= hi();
  }
}